

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall cmCTestP4::DiffParser::DiffParser(DiffParser *this,cmCTestP4 *p4,char *prefix)

{
  char *prefix_local;
  cmCTestP4 *p4_local;
  DiffParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DiffParser_016761d8;
  this->P4 = p4;
  this->AlreadyNotified = false;
  std::__cxx11::string::string((string *)&this->CurrentPath);
  cmsys::RegularExpression::RegularExpression(&this->RegexDiff);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(this->P4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexDiff,"^==== (.*)#[0-9]+ - (.*)");
  return;
}

Assistant:

DiffParser(cmCTestP4* p4, const char* prefix)
    : P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexDiff.compile("^==== (.*)#[0-9]+ - (.*)");
  }